

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O2

BerdyOptions * __thiscall
iDynTree::BerdyHelper::getOptions(BerdyOptions *__return_storage_ptr__,BerdyHelper *this)

{
  BerdyOptions::BerdyOptions(__return_storage_ptr__,&this->m_options);
  return __return_storage_ptr__;
}

Assistant:

BerdyOptions BerdyHelper::getOptions() const
{
    return m_options;
}